

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh.cpp
# Opt level: O2

VolumeMeshCellVectorQuantity * __thiscall
polyscope::VolumeMesh::addCellVectorQuantityImpl
          (VolumeMesh *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vectors,VectorType vectorType)

{
  VolumeMeshCellVectorQuantity *this_00;
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_80;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)name);
  QuantityStructure<polyscope::VolumeMesh>::checkForQuantityWithNameAndDeleteOrError
            (&this->super_QuantityStructure<polyscope::VolumeMesh>,&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  this_00 = (VolumeMeshCellVectorQuantity *)operator_new(0x3a8);
  std::__cxx11::string::string((string *)&local_68,(string *)name);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)&local_80,vectors);
  VolumeMeshCellVectorQuantity::VolumeMeshCellVectorQuantity
            (this_00,&local_68,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&local_80,this,vectorType);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&local_80);
  std::__cxx11::string::~string((string *)&local_68);
  QuantityStructure<polyscope::VolumeMesh>::addQuantity
            (&this->super_QuantityStructure<polyscope::VolumeMesh>,(QuantityType *)this_00,true);
  return this_00;
}

Assistant:

VolumeMeshCellVectorQuantity*
VolumeMesh::addCellVectorQuantityImpl(std::string name, const std::vector<glm::vec3>& vectors, VectorType vectorType) {

  checkForQuantityWithNameAndDeleteOrError(name);
  VolumeMeshCellVectorQuantity* q = new VolumeMeshCellVectorQuantity(name, vectors, *this, vectorType);
  addQuantity(q);
  return q;
}